

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

SubroutineSymbol *
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,DPIImportSyntax *syntax,Scope *parent)

{
  uint uVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  TokenKind TVar4;
  FunctionPrototypeSyntax *pFVar5;
  long lVar6;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  underlying_type uVar10;
  bitmask<slang::ast::MethodFlags> bVar11;
  int iVar12;
  SubroutineSymbol *pSVar13;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  size_type sVar14;
  Compilation *ctx;
  char *pcVar15;
  long lVar16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view __x;
  SourceRange sourceRange;
  SubroutineKind subroutineKind;
  SubroutineSymbol *local_a0;
  Compilation *local_98;
  VariableLifetime local_8c;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  SourceLocation local_48;
  Token nameToken;
  
  pFVar5 = (syntax->method).ptr;
  nameToken = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(pFVar5->name).ptr);
  subroutineKind = (SubroutineKind)((pFVar5->keyword).kind == TaskKeyword);
  arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>._0_16_ =
       parsing::Token::valueText(&nameToken);
  local_48 = parsing::Token::location(&nameToken);
  local_8c = Automatic;
  pSVar13 = BumpAllocator::
            emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
                      (&compilation->super_BumpAllocator,compilation,
                       (basic_string_view<char,_std::char_traits<char>_> *)&arguments,&local_48,
                       &local_8c,&subroutineKind);
  (pSVar13->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&pSVar13->super_Symbol,parent,syntax_00);
  (pSVar13->flags).m_bits = 0x80;
  pbVar2 = (byte *)((long)&(pSVar13->declaredReturnType).flags.m_bits + 1);
  *pbVar2 = *pbVar2 | 4;
  if (subroutineKind == Function) {
    (pSVar13->declaredReturnType).typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar5->returnType).ptr;
    puVar3 = &(pSVar13->declaredReturnType).field_0x3f;
    *puVar3 = *puVar3 & 0x7f;
  }
  else {
    (pSVar13->declaredReturnType).type = compilation->voidType;
  }
  TVar4 = (syntax->property).kind;
  if (TVar4 == PureKeyword) {
    bVar8 = 0;
    uVar10 = 0x82;
  }
  else {
    bVar8 = 1;
    if (TVar4 != ContextKeyword) goto LAB_00211a27;
    bVar8 = 1;
    uVar10 = 0x180;
  }
  (pSVar13->flags).m_bits = uVar10;
LAB_00211a27:
  __x = parsing::Token::valueText(&syntax->specString);
  __y._M_str = "DPI";
  __y._M_len = 3;
  bVar9 = std::operator==(__x,__y);
  if (bVar9) {
    sourceRange = parsing::Token::range(&syntax->specString);
    Scope::addDiag(parent,(DiagCode)0xea0006,sourceRange);
  }
  pcVar15 = arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.firstElement;
  arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len = 0;
  arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.data_ = (pointer)pcVar15
  ;
  arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.cap = 5;
  local_a0 = pSVar13;
  local_98 = compilation;
  if (pFVar5->portList == (FunctionPortListSyntax *)0x0) {
    sVar14 = 0;
    src = (EVP_PKEY_CTX *)0x0;
  }
  else {
    bVar11 = buildArguments(&pSVar13->super_Scope,parent,pFVar5->portList,Automatic,
                            &arguments.
                             super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>);
    (pSVar13->flags).m_bits = (pSVar13->flags).m_bits | bVar11.m_bits;
    src = extraout_RDX;
    sVar14 = arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len;
    pcVar15 = (char *)arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.
                      data_;
  }
  bVar7 = 0;
  for (lVar16 = 0; sVar14 * 8 != lVar16; lVar16 = lVar16 + 8) {
    lVar6 = *(long *)(pcVar15 + lVar16);
    *(uint *)(lVar6 + 0x78) = *(uint *)(lVar6 + 0x78) | 0x800;
    uVar1 = *(int *)(lVar6 + 0x158) - 1;
    src = (EVP_PKEY_CTX *)(ulong)uVar1;
    if (uVar1 < 2) {
      if (!(bool)(bVar8 | bVar7)) {
        bVar7 = 1;
        Scope::addDiag(parent,(DiagCode)0x250006,*(SourceLocation *)(lVar6 + 0x18));
        src = extraout_RDX_00;
      }
    }
    else if (*(int *)(lVar6 + 0x158) == 3) {
      Scope::addDiag(parent,(DiagCode)0x270006,*(SourceLocation *)(lVar6 + 0x18));
      src = extraout_RDX_01;
    }
  }
  ctx = local_98;
  iVar12 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                     (&arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
                      (EVP_PKEY_CTX *)local_98,src);
  pSVar13 = local_a0;
  (local_a0->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar12);
  (local_a0->arguments)._M_extent._M_extent_value = extraout_RDX_02;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup
            (&arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
             (EVP_PKEY_CTX *)ctx);
  return pSVar13;
}

Assistant:

SubroutineSymbol& SubroutineSymbol::fromSyntax(Compilation& compilation,
                                               const DPIImportSyntax& syntax, const Scope& parent) {
    auto& proto = *syntax.method;
    Token nameToken = proto.name->getLastToken();
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    auto result = compilation.emplace<SubroutineSymbol>(compilation, nameToken.valueText(),
                                                        nameToken.location(),
                                                        VariableLifetime::Automatic,
                                                        subroutineKind);
    result->setSyntax(syntax);
    result->setAttributes(parent, syntax.attributes);
    result->flags = MethodFlags::DPIImport;

    result->declaredReturnType.addFlags(DeclaredTypeFlags::DPIReturnType);
    if (subroutineKind == SubroutineKind::Function)
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(compilation.getVoidType());

    bool isPure = false;
    switch (syntax.property.kind) {
        case TokenKind::PureKeyword:
            isPure = true;
            result->flags |= MethodFlags::Pure;
            break;
        case TokenKind::ContextKeyword:
            result->flags |= MethodFlags::DPIContext;
            break;
        default:
            break;
    }

    if (syntax.specString.valueText() == "DPI")
        parent.addDiag(diag::DPISpecDisallowed, syntax.specString.range());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, parent, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    // Check arguments for extra rules imposed by DPI imports.
    bool pureError = false;
    for (auto arg : arguments) {
        const_cast<FormalArgumentSymbol*>(arg)->getDeclaredType()->addFlags(
            DeclaredTypeFlags::DPIArg);

        if (arg->direction == ArgumentDirection::Ref)
            parent.addDiag(diag::DPIRefArg, arg->location);
        else if (arg->direction == ArgumentDirection::Out ||
                 arg->direction == ArgumentDirection::InOut) {
            if (isPure && !pureError) {
                parent.addDiag(diag::DPIPureArg, arg->location);
                pureError = true;
            }
        }
    }

    result->arguments = arguments.copy(compilation);
    return *result;
}